

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[10],unsigned_long,char_const(&)[23]>
          (String *__return_storage_ptr__,kj *this,char (*params) [10],unsigned_long *params_1,
          char (*params_2) [23])

{
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  CappedArray<char,_26UL> local_50;
  
  local_60 = toCharSequence<char_const(&)[10]>((char (*) [10])this);
  toCharSequence<unsigned_long>(&local_50,(unsigned_long *)params);
  local_70 = toCharSequence<char_const(&)[23]>((char (*) [23])params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_60,(ArrayPtr<const_char> *)&local_50,
             (CappedArray<char,_26UL> *)&local_70,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}